

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfilters.c
# Opt level: O1

void Curl_conn_forget_socket(Curl_easy *data,int sockindex)

{
  Curl_cfilter *pCVar1;
  Curl_cft_cntrl *pCVar2;
  
  if (data->conn != (connectdata *)0x0) {
    for (pCVar1 = data->conn->cfilter[sockindex]; pCVar1 != (Curl_cfilter *)0x0;
        pCVar1 = pCVar1->next) {
      pCVar2 = pCVar1->cft->cntrl;
      if (pCVar2 != Curl_cf_def_cntrl) {
        (*pCVar2)(pCVar1,data,0x101,0,(void *)0x0);
      }
    }
    data->conn->sock[sockindex] = -1;
  }
  return;
}

Assistant:

void Curl_conn_forget_socket(struct Curl_easy *data, int sockindex)
{
  if(data->conn) {
    struct Curl_cfilter *cf = data->conn->cfilter[sockindex];
    if(cf)
      (void)Curl_conn_cf_cntrl(cf, data, TRUE,
                               CF_CTRL_FORGET_SOCKET, 0, NULL);
    fake_sclose(data->conn->sock[sockindex]);
    data->conn->sock[sockindex] = CURL_SOCKET_BAD;
  }
}